

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O2

ObjectPtr __thiscall ICM::DefFunc::Lists::Foreach::func(Foreach *this,DataList *list)

{
  pointer pFVar1;
  long *plVar2;
  size_t sVar3;
  size_t sVar4;
  DataObject<(ICM::DefaultType)17> *this_00;
  RIterator<unsigned_long> __begin3;
  long lVar5;
  long *in_RDX;
  ulong uVar6;
  ulong uVar7;
  RIterator<unsigned_long> __end3;
  size_t capacity;
  FuncTableUnit *ftu;
  DataList ldl;
  Object *local_60;
  vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> dls;
  undefined8 local_38;
  
  ftu = (FuncTableUnit *)(**(long **)(*(long *)in_RDX[1] + 8) * 0x78 + GlobalFunctionTable._8_8_);
  ldl._capacity = (size_t)&local_60;
  local_60 = (Object *)(Static + 0x40);
  ldl._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x1;
  Common::lightlist<ICM::Object_*>::lightlist
            ((lightlist<ICM::Object_*> *)&dls,(initializer_list<ICM::Object_*> *)&ldl);
  sVar3 = getCallID(ftu,(lightlist<ICM::Object_*> *)&dls);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &dls.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pFVar1 = (ftu->func).
           super__Vector_base<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar2 = *(long **)(*(long *)(in_RDX[1] + 8) + 8);
  uVar6 = plVar2[1] - *plVar2 >> 3;
  for (lVar5 = 1; *in_RDX != lVar5; lVar5 = lVar5 + 1) {
    plVar2 = *(long **)(*(long *)(in_RDX[1] + lVar5 * 8) + 8);
    uVar7 = plVar2[1] - *plVar2 >> 3;
    if (uVar7 < uVar6) {
      uVar6 = uVar7;
    }
  }
  dls.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dls.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dls.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  capacity = *in_RDX - 1;
  for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    Common::lightlist<ICM::Object_*>::lightlist(&ldl,capacity);
    for (sVar4 = 0; capacity != sVar4; sVar4 = sVar4 + 1) {
      ldl._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr[sVar4] =
           *(element_type *)(**(long **)(*(long *)(in_RDX[1] + 8 + sVar4 * 8) + 8) + uVar7 * 8);
    }
    std::function<ICM::ObjectPtr_(const_Common::lightlist<ICM::Object_*>_&)>::operator()
              ((function<ICM::ObjectPtr_(const_Common::lightlist<ICM::Object_*>_&)> *)
               &stack0xffffffffffffffc8,(lightlist<ICM::Object_*> *)(pFVar1 + sVar3));
    local_60 = (Object *)local_38;
    std::vector<ICM::Object*,std::allocator<ICM::Object*>>::emplace_back<ICM::Object*>
              ((vector<ICM::Object*,std::allocator<ICM::Object*>> *)&dls,&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ldl._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  this_00 = (DataObject<(ICM::DefaultType)17> *)operator_new(0x10);
  std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::vector
            ((vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&ldl,&dls);
  Objects::DataObject<(ICM::DefaultType)17>::DataObject(this_00,(T *)&ldl);
  std::_Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>::~_Vector_base
            ((_Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&ldl);
  (this->super_FI)._vptr_FuncInitObject = (_func_int **)this_00;
  std::_Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>::~_Vector_base
            (&dls.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					// TODO
					auto &func = list[0]->get<T_Function>()->getData();
					size_t id = getCallID(func, DataList({ &Static.Zero }));
					const auto &rf = func[id];

					size_t minsize = list[1]->get<T_List>()->size();
					size_t size = list.size();
					for (auto i : range(1, size))
						minsize = std::min(minsize, list[i]->get<T_List>()->size());
					vector<Object*> dls;
					Object obj;
					for (size_t i : range(0, minsize)) {
						DataList ldl(size - 1);
						for (auto id : range(1, size))
							ldl[id - 1] = list[id]->get<T_List>()->getData()[i];
						dls.push_back(rf.call(ldl).get());
					}
					List *result = new List(ListType(dls));
					return ObjectPtr(result);
				}